

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybrid_breadth_first.cpp
# Opt level: O3

vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> * __thiscall
HBF::reconstruct_path
          (vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> *__return_storage_ptr__,HBF *this,
          vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
          came_from,vector<double,_std::allocator<double>_> start,maze_s final)

{
  int iVar1;
  long lVar2;
  iterator __position;
  double dVar3;
  double dVar4;
  undefined8 *in_RCX;
  long *in_RDX;
  ulong uVar5;
  double *pdVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  initializer_list<HBF::maze_s> __l;
  allocator_type local_61;
  double local_60;
  maze_s local_58;
  
  local_58.y = (double)came_from.
                       super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_58.theta =
       (double)start.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
  local_58.g = (double)came_from.
                       super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
  local_58.x = (double)came_from.
                       super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
  __l._M_len = 1;
  __l._M_array = &local_58;
  std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>::vector
            (__return_storage_ptr__,__l,&local_61);
  dVar3 = fmod((double)start.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + 6.283185307179586,6.283185307179586);
  iVar1 = this->NUM_THETA_CELLS;
  dVar3 = round((dVar3 * (double)iVar1) / 6.283185307179586);
  lVar2 = *in_RDX;
  dVar4 = floor((double)came_from.
                        super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
  lVar2 = *(long *)(lVar2 + (long)((int)dVar3 % iVar1) * 0x18);
  dVar3 = floor((double)came_from.
                        super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  lVar2 = *(long *)(lVar2 + (long)(int)dVar4 * 0x18);
  pdVar6 = (double *)(lVar2 + (long)(int)dVar3 * 0x20);
  local_58.g = *pdVar6;
  local_58.x = pdVar6[1];
  pdVar6 = (double *)(lVar2 + 0x10 + (long)(int)dVar3 * 0x20);
  local_58.y = *pdVar6;
  local_58.theta = pdVar6[1];
  dVar3 = fmod(local_58.theta + 6.283185307179586,6.283185307179586);
  dVar4 = local_58.y;
  pdVar6 = (double *)*in_RCX;
  local_60 = local_58.x;
  if ((local_58.x != *pdVar6) || (NAN(local_58.x) || NAN(*pdVar6))) {
    iVar1 = this->NUM_THETA_CELLS;
    dVar3 = round((dVar3 * (double)iVar1) / 6.283185307179586);
    uVar7 = SUB84(dVar4,0);
    uVar8 = (undefined4)((ulong)dVar4 >> 0x20);
    uVar5 = (long)(int)dVar3 % (long)iVar1 & 0xffffffff;
    do {
      if (((double)CONCAT44(uVar8,uVar7) == pdVar6[1]) &&
         (!NAN((double)CONCAT44(uVar8,uVar7)) && !NAN(pdVar6[1]))) {
        return __return_storage_ptr__;
      }
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<HBF::maze_s,std::allocator<HBF::maze_s>>::_M_realloc_insert<HBF::maze_s_const&>
                  ((vector<HBF::maze_s,std::allocator<HBF::maze_s>> *)__return_storage_ptr__,
                   __position,&local_58);
      }
      else {
        (__position._M_current)->y = local_58.y;
        (__position._M_current)->theta = local_58.theta;
        (__position._M_current)->g = local_58.g;
        (__position._M_current)->x = local_58.x;
        (__return_storage_ptr__->super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>).
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      lVar2 = *in_RDX;
      dVar3 = floor(local_60);
      lVar2 = *(long *)(lVar2 + (long)(int)uVar5 * 0x18);
      dVar4 = floor((double)CONCAT44(uVar8,uVar7));
      lVar2 = *(long *)(lVar2 + (long)(int)dVar3 * 0x18);
      pdVar6 = (double *)(lVar2 + (long)(int)dVar4 * 0x20);
      local_58.g = *pdVar6;
      local_60 = pdVar6[1];
      pdVar6 = (double *)(lVar2 + 0x10 + (long)(int)dVar4 * 0x20);
      dVar4 = *pdVar6;
      local_58.theta = pdVar6[1];
      local_58.x = local_60;
      local_58.y = dVar4;
      dVar3 = fmod(local_58.theta + 6.283185307179586,6.283185307179586);
      iVar1 = this->NUM_THETA_CELLS;
      dVar3 = round((dVar3 * (double)iVar1) / 6.283185307179586);
      uVar7 = SUB84(dVar4,0);
      uVar8 = (undefined4)((ulong)dVar4 >> 0x20);
      uVar5 = (long)(int)dVar3 % (long)iVar1 & 0xffffffff;
      pdVar6 = (double *)*in_RCX;
    } while ((local_60 != *pdVar6) || (NAN(local_60) || NAN(*pdVar6)));
  }
  return __return_storage_ptr__;
}

Assistant:

vector<HBF::maze_s>
HBF::reconstruct_path(vector<vector<vector<HBF::maze_s> > > came_from, vector<double> start, HBF::maze_s final) {

    vector<maze_s> path = {final};

    int stack = theta_to_stack_number(final.theta);

    maze_s current = came_from[stack][idx(final.x)][idx(final.y)];

    stack = theta_to_stack_number(current.theta);

    double x = current.x;
    double y = current.y;
    while (x != start[0] && y != start[1]) {
        path.push_back(current);
        current = came_from[stack][idx(x)][idx(y)];
        x = current.x;
        y = current.y;
        stack = theta_to_stack_number(current.theta);
    }

    return path;

}